

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::FindMSBCase::compare(FindMSBCase *this,void **inputs,void **outputs)

{
  deUint32 value_00;
  int x;
  bool bVar1;
  bool bVar2;
  DataType dataType;
  Precision precision_00;
  int iVar3;
  int numIntegerBits;
  deInt32 value_01;
  int a;
  deUint32 value_02;
  reference pvVar4;
  ostream *poVar5;
  int local_60;
  int maxRef;
  int minRef;
  int out;
  deUint32 value;
  int compNdx;
  int integerLength;
  int scalarSize;
  bool isSigned;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  FindMSBCase *this_local;
  
  pvVar4 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_IntegerFunctionCase).m_spec.inputs,0);
  dataType = glu::VarType::getBasicType(&pvVar4->varType);
  pvVar4 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_IntegerFunctionCase).m_spec.inputs,0);
  precision_00 = glu::VarType::getPrecision(&pvVar4->varType);
  bVar1 = glu::isDataTypeIntOrIVec(dataType);
  iVar3 = glu::getDataTypeScalarSize(dataType);
  numIntegerBits =
       anon_unknown_3::getShaderUintBitCount
                 ((this->super_IntegerFunctionCase).m_shaderType,precision_00);
  out = 0;
  while( true ) {
    if (iVar3 <= out) {
      return true;
    }
    value_00 = *(deUint32 *)((long)*inputs + (long)out * 4);
    x = *(int *)((long)*outputs + (long)out * 4);
    if (bVar1) {
      value_01 = toPrecision(value_00,numIntegerBits);
      a = findMSB(value_01);
      local_60 = findMSB(value_00);
    }
    else {
      value_02 = toPrecision(value_00,numIntegerBits);
      a = findMSB(value_02);
      local_60 = findMSB(value_00);
    }
    bVar2 = de::inRange<int>(x,a,local_60);
    if (!bVar2) break;
    out = out + 1;
  }
  poVar5 = std::operator<<((ostream *)&(this->super_IntegerFunctionCase).m_failMsg,"Expected [");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,out);
  poVar5 = std::operator<<(poVar5,"] in range [");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,a);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_60);
  std::operator<<(poVar5,"]");
  return false;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				isSigned		= glu::isDataTypeIntOrIVec(type);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const int		out		= ((const deInt32*)outputs[0])[compNdx];
			const int		minRef	= isSigned ? findMSB(toPrecision(deInt32(value), integerLength))	: findMSB(toPrecision(value, integerLength));
			const int		maxRef	= isSigned ? findMSB(deInt32(value))								: findMSB(value);

			if (!de::inRange(out, minRef, maxRef))
			{
				m_failMsg << "Expected [" << compNdx << "] in range [" << minRef << ", " << maxRef << "]";
				return false;
			}
		}

		return true;
	}